

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void geopolyCcwFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  undefined8 uVar1;
  uint uVar2;
  bool bVar3;
  GeoPoly *p;
  long lVar4;
  long lVar5;
  double dVar6;
  
  p = geopolyFuncParam(context,*argv,(int *)0x0);
  if (p != (GeoPoly *)0x0) {
    dVar6 = geopolyArea(p);
    uVar2 = p->nVertex;
    if (2 < (int)uVar2 && dVar6 < 0.0) {
      lVar5 = 1;
      lVar4 = (ulong)uVar2 - 2;
      do {
        uVar1 = *(undefined8 *)(p->a + lVar5 * 2);
        *(undefined8 *)(p->a + lVar5 * 2) = *(undefined8 *)(p->a + lVar4 * 2 + 2);
        *(undefined8 *)(p->a + lVar4 * 2 + 2) = uVar1;
        lVar5 = lVar5 + 1;
        bVar3 = lVar5 < lVar4;
        lVar4 = lVar4 + -1;
      } while (bVar3);
    }
    setResultStrOrError(context,(char *)p->hdr,uVar2 * 8 + 4,'\0',
                        (_func_void_void_ptr *)0xffffffffffffffff);
    sqlite3_free(p);
    return;
  }
  return;
}

Assistant:

static void geopolyCcwFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  GeoPoly *p = geopolyFuncParam(context, argv[0], 0);
  (void)argc;
  if( p ){
    if( geopolyArea(p)<0.0 ){
      int ii, jj;
      for(ii=1, jj=p->nVertex-1; ii<jj; ii++, jj--){
        GeoCoord t = GeoX(p,ii);
        GeoX(p,ii) = GeoX(p,jj);
        GeoX(p,jj) = t;
        t = GeoY(p,ii);
        GeoY(p,ii) = GeoY(p,jj);
        GeoY(p,jj) = t;
      }
    }
    sqlite3_result_blob(context, p->hdr,
       4+8*p->nVertex, SQLITE_TRANSIENT);
    sqlite3_free(p);
  }
}